

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void label_cb(Fl_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Fl_Type *this;
  
  if ((char *)v == "LOAD") {
    Fl_Input_::static_value(&i->super_Fl_Input_,(current_widget->super_Fl_Type).label_);
    sVar3 = strlen((i->super_Fl_Input_).value_);
    if (oldlabellen <= sVar3) {
      oldlabellen = (int)sVar3 + 0x80;
      oldlabel = (char *)realloc(oldlabel,(ulong)oldlabellen);
    }
    strcpy(oldlabel,(i->super_Fl_Input_).value_);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar1 = false;
    this = Fl_Type::first;
    do {
      if (this->selected != '\0') {
        iVar2 = (*this->_vptr_Fl_Type[0x17])(this);
        if (iVar2 != 0) {
          Fl_Type::label(this,(i->super_Fl_Input_).value_);
          bVar1 = true;
        }
      }
      this = this->next;
    } while (this != (Fl_Type *)0x0);
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void label_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    i->static_value(current_widget->label());
    if (strlen(i->value()) >= oldlabellen) {
      oldlabellen = strlen(i->value())+128;
      oldlabel = (char*)realloc(oldlabel,oldlabellen);
    }
    strcpy(oldlabel,i->value());
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        o->label(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}